

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool __thiscall Pathie::Path::is_file(Path *this)

{
  int iVar1;
  char *__file;
  int *piVar2;
  ErrnoError *this_00;
  int errsav;
  undefined1 local_c8 [8];
  string nstr;
  undefined1 local_a8 [8];
  stat s;
  Path *this_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)this;
  native_abi_cxx11_((Path *)local_c8);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = ::stat(__file,(stat *)local_a8);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 != 2) {
      this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
      ErrnoError::ErrnoError(this_00,iVar1);
      __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
    }
    this_local._7_1_ = false;
  }
  else if (((uint)s.st_nlink & 0xf000) == 0x8000) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_c8);
  return this_local._7_1_;
}

Assistant:

bool Path::is_file() const
{
#if defined(_PATHIE_UNIX)
  struct stat s;
  std::string nstr = native();

  if (::stat(nstr.c_str(), &s) < 0) {
    int errsav = errno;

    if (errsav == ENOENT)
      return false;
    else
      throw(Pathie::ErrnoError(errsav));
  }

  if (S_ISREG(s.st_mode))
    return true;
  else
    return false;
#elif defined(_WIN32)
  struct _stat s;
  std::wstring utf16 = utf8_to_utf16(m_path);
  if (_wstat(utf16.c_str(), &s) < 0) {
    int errsav = errno;

    if (errsav == ENOENT)
      return false;
    else
      throw(Pathie::ErrnoError(errno));
  }

  return s.st_mode & S_IFREG;
#else
#error Unsupported system.
#endif
}